

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O2

PhysicalDeviceDetails * get_physical_device_details(VkPhysicalDevice physicalDevice)

{
  long lVar1;
  size_t i;
  long lVar2;
  
  lVar1 = 0;
  lVar2 = 0;
  while( true ) {
    if ((long)mock.physical_device_handles.
              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)mock.physical_device_handles.
              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3 == lVar2) {
      __assert_fail("false && \"should never reach here!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/tests/vulkan_mock.cpp"
                    ,0x72,
                    "VulkanMock::PhysicalDeviceDetails &get_physical_device_details(VkPhysicalDevice)"
                   );
    }
    if (mock.physical_device_handles.
        super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar2] == physicalDevice) break;
    lVar2 = lVar2 + 1;
    lVar1 = lVar1 + -0x698;
  }
  return (PhysicalDeviceDetails *)
         ((long)mock.physical_devices_details.
                super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
                ._M_impl.super__Vector_impl_data._M_start - lVar1);
}

Assistant:

VulkanMock::PhysicalDeviceDetails& get_physical_device_details(VkPhysicalDevice physicalDevice) {
    for (size_t i = 0; i < mock.physical_device_handles.size(); i++) {
        if (mock.physical_device_handles[i] == physicalDevice) return mock.physical_devices_details[i];
    }
    assert(false && "should never reach here!");
    return mock.physical_devices_details.front();
}